

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

BuildValue * __thiscall
anon_unknown.dwarf_643cf::StaleFileRemovalCommand::getResultForOutput
          (BuildValue *__return_storage_ptr__,StaleFileRemovalCommand *this,Node *node,
          BuildValue *value)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_28;
  
  if (value->kind - FailedCommand < 3) {
    __return_storage_ptr__->kind = FailedInput;
  }
  else {
    if (value->kind != SkippedCommand) {
      llbuild::buildsystem::BuildValue::toData((ValueType *)&_Stack_28,value);
      llbuild::buildsystem::BuildValue::fromData(__return_storage_ptr__,(ValueType *)&_Stack_28);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_28);
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->kind = SkippedCommand;
  }
  *(undefined8 *)&__return_storage_ptr__->numOutputInfos = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->signature).value + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.device + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.inode + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.mode + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.size + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.modTime.seconds + 4) = 0;
  *(undefined8 *)((long)&(__return_storage_ptr__->valueData).asOutputInfo.modTime.nanoseconds + 4) =
       0;
  *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x34) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x3c) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x44) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->valueData + 0x4c) = 0;
  (__return_storage_ptr__->stringValues).contents = (char *)0x0;
  (__return_storage_ptr__->stringValues).size = 0;
  return __return_storage_ptr__;
}

Assistant:

virtual BuildValue getResultForOutput(Node* node,
                                        const BuildValue& value) override {
    // If the value was a failed command, propagate the failure.
    if (value.isFailedCommand() || value.isPropagatedFailureCommand() ||
        value.isCancelledCommand())
      return BuildValue::makeFailedInput();
    if (value.isSkippedCommand())
      return BuildValue::makeSkippedCommand();

    // Otherwise, this was successful, return the value as-is.
    return BuildValue::fromData(value.toData());;
  }